

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

int afm_stream_skip_spaces(AFM_Stream stream)

{
  byte *pbVar1;
  uint local_20;
  int ch;
  AFM_Stream stream_local;
  
  if (stream->status < 1) {
    do {
      if (stream->cursor < stream->limit) {
        pbVar1 = stream->cursor;
        stream->cursor = pbVar1 + 1;
        local_20 = (uint)*pbVar1;
      }
      else {
        local_20 = 0xffffffff;
      }
    } while ((local_20 == 0x20) || (local_20 == 9));
    if ((local_20 == 0xd) || (local_20 == 10)) {
      stream->status = 2;
    }
    else if (local_20 == 0x3b) {
      stream->status = 1;
    }
    else if ((local_20 == 0xffffffff) || (local_20 == 0x1a)) {
      stream->status = 3;
    }
    stream_local._4_4_ = local_20;
  }
  else {
    stream_local._4_4_ = 0x3b;
  }
  return stream_local._4_4_;
}

Assistant:

static int
  afm_stream_skip_spaces( AFM_Stream  stream )
  {
    int  ch = 0;  /* make stupid compiler happy */


    if ( AFM_STATUS_EOC( stream ) )
      return ';';

    while ( 1 )
    {
      ch = AFM_GETC();
      if ( !AFM_IS_SPACE( ch ) )
        break;
    }

    if ( AFM_IS_NEWLINE( ch ) )
      stream->status = AFM_STREAM_STATUS_EOL;
    else if ( AFM_IS_SEP( ch ) )
      stream->status = AFM_STREAM_STATUS_EOC;
    else if ( AFM_IS_EOF( ch ) )
      stream->status = AFM_STREAM_STATUS_EOF;

    return ch;
  }